

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimAngular::Read(ON_OBSOLETE_V5_DimAngular *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool local_29;
  int local_28;
  bool bInChunk;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_OBSOLETE_V5_DimAngular *this_local;
  
  iStack_24 = 0;
  local_28 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar4 = false;
  if (4 < iVar2) {
    uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version);
    bVar4 = 0xbf69823 < uVar3;
  }
  if (bVar4) {
    local_29 = ON_BinaryArchive::BeginRead3dmChunk
                         (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
    if (!local_29) {
      return false;
    }
  }
  else {
    local_29 = true;
  }
  if (local_29 != false) {
    bVar1 = ON_OBSOLETE_V5_Annotation::Read(&this->super_ON_OBSOLETE_V5_Annotation,_minor_version);
    if ((-bVar1 & 1U) == 0) {
      local_29 = false;
    }
    else {
      local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_angle);
      if (local_29) {
        local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_radius);
      }
    }
  }
  if ((bVar4) && (bVar4 = ON_BinaryArchive::EndRead3dmChunk(_minor_version), !bVar4)) {
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::Read( ON_BinaryArchive& file )
{
  // 18 October 2007 Dale Lear
  //    I added the chunk wrapping so V5 and future versions can
  //    add IO support for information specific to ON_OBSOLETE_V5_DimAngular
  int major_version = 0;
  int minor_version = 0;
  bool rc = false;
  bool bInChunk = (file.Archive3dmVersion() >= 5 && file.ArchiveOpenNURBSVersion() >= 200710180);
  if ( bInChunk )
  {
    rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
    if ( !rc )
      return false;
  }
  else
  {
    rc = true;
  }

  while(rc)
  {
    rc = ON_OBSOLETE_V5_Annotation::Read(file)?true:false;
    if (!rc) break;
    rc = file.ReadDouble( &m_angle);
    if (!rc) break;
    rc = file.ReadDouble( &m_radius);
    if (!rc) break;
    if ( !bInChunk || minor_version <= 0 )
      break;

    // Code to read any new ON_OBSOLETE_V5_DimAngular fields will 
    // go here.

    break;
  }

  if ( bInChunk )
  {
    // To read new ON_OBSOLETE_V5_DimAngular specific additions,
    // examine the minor version number and read the information
    // here.  Please ask Dale Lear for help.

    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}